

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c-leakcheck.h
# Opt level: O0

void init_fd_checking(void)

{
  int iVar1;
  int local_18;
  int local_14;
  int fds_2 [2];
  int fds_1 [2];
  
  iVar1 = pipe2(fds_2,0x80000);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x18,"pipe2(fds_1, O_CLOEXEC) == 0");
  }
  fd_leak_test_a = fds_2[0];
  fd_leak_test_b = fds_2[1];
  iVar1 = pipe2(&local_18,0x80000);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x1e,"pipe2(fds_2, O_CLOEXEC) == 0");
  }
  fd_leak_test_c = local_18;
  fd_leak_test_d = local_14;
  iVar1 = close(fds_2[0]);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x22,"close(fds_1[0]) == 0");
  }
  iVar1 = close(fds_2[1]);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x23,"close(fds_1[1]) == 0");
  }
  iVar1 = close(local_18);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x24,"close(fds_2[0]) == 0");
  }
  iVar1 = close(local_14);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/atf-c-leakcheck.h"
               ,0x25,"close(fds_2[1]) == 0");
  }
  return;
}

Assistant:

static void
init_fd_checking(void)
{
	/* We check for fd leaks after each test. Remember fd numbers for
	 * checking here. */
	int fds_1[2];
	ATF_REQUIRE(pipe2(fds_1, O_CLOEXEC) == 0);

	fd_leak_test_a = fds_1[0];
	fd_leak_test_b = fds_1[1];

	int fds_2[2];
	ATF_REQUIRE(pipe2(fds_2, O_CLOEXEC) == 0);
	fd_leak_test_c = fds_2[0];
	fd_leak_test_d = fds_2[1];

	ATF_REQUIRE(close(fds_1[0]) == 0);
	ATF_REQUIRE(close(fds_1[1]) == 0);
	ATF_REQUIRE(close(fds_2[0]) == 0);
	ATF_REQUIRE(close(fds_2[1]) == 0);
}